

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_EnumValueAliasError_Test::
~ParserValidationErrorTest_EnumValueAliasError_Test
          (ParserValidationErrorTest_EnumValueAliasError_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParserValidationErrorTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, EnumValueAliasError) {
  ExpectHasValidationErrors(
      "enum Foo {\n"
      "  BAR = 1;\n"
      "  BAZ = 1;\n"
      "}\n",
      "2:8: \"BAZ\" uses the same enum value as \"BAR\". If this is "
      "intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 2.\n");
}